

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O3

void __thiscall fmp4_stream::sc35_splice_info::parse(sc35_splice_info *this,uint8_t *ptr,uint size)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  uint8_t uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = *ptr;
  this->table_id_ = uVar5;
  if (uVar5 == 0xfc) {
    bVar1 = ptr[1];
    this->section_syntax_indicator_ = (bool)(bVar1 >> 7);
    this->private_indicator_ = (bool)(bVar1 >> 6 & 1);
    this->section_length_ = (*(ushort *)(ptr + 1) & 0xff0f) << 8 | *(ushort *)(ptr + 1) >> 8;
    this->protocol_version_ = ptr[3];
    bVar1 = ptr[4];
    this->encrypted_packet_ = (bool)(bVar1 >> 7);
    this->encryption_algorithm_ = bVar1 >> 1 & 0x3f;
    uVar2 = *(uint *)(ptr + 5);
    uVar6 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
    ;
    uVar7 = uVar6 + 0xffffffff;
    if ((bVar1 & 1) == 0) {
      uVar7 = uVar6;
    }
    this->pts_adjustment_ = uVar7;
    this->cw_index_ = ptr[9];
    uVar2 = *(uint *)(ptr + 10);
    uVar3 = (uVar2 & 0xff00) << 8;
    this->tier_ = (uVar3 | uVar2 << 0x18) >> 0x14;
    this->splice_command_length_ = ((uVar2 & 0xff0000) >> 8 | uVar3 & 0xfff00) >> 8;
    uVar5 = (uint8_t)(uVar2 >> 0x18);
    this->splice_command_type_ = uVar5;
    uVar4 = *(ushort *)(ptr + 0xe) << 8 | *(ushort *)(ptr + 0xe) >> 8;
    this->descriptor_loop_length_ = uVar4;
    if (uVar5 == '\x05') {
      uVar2 = *(uint *)(ptr + (ulong)uVar4 + 0xe);
      this->splice_insert_event_id_ =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      this->splice_event_cancel_indicator_ = (bool)(ptr[(ulong)uVar4 + 0x12] >> 7);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," error parsing table id, tableid != 0xFC ",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return;
}

Assistant:

void sc35_splice_info::parse(const uint8_t *ptr, unsigned int size)
	{
		table_id_ = *ptr++;

		if (table_id_ != 0xFC)
		{
			std::cout << " error parsing table id, tableid != 0xFC " << std::endl;
			return;
		}

		std::bitset<8> b(*ptr);
		section_syntax_indicator_ = b[7];
		private_indicator_ = b[6];
		section_length_ = 0x0FFF & fmp4_read_uint16((char *)ptr);
		ptr += 2;
		protocol_version_ = (uint8_t)*ptr++;

		b = std::bitset<8>(*ptr);

		encrypted_packet_ = b[7];
		bool pts_highest_bit = b[0];

		b[0] = 0;
		b[7] = 0;
		encryption_algorithm_ = uint8_t(b.to_ullong() >> 1);
		ptr++;

		pts_adjustment_ = (uint64_t)fmp4_read_uint32((char *)ptr);
		if (pts_highest_bit)
		{
			pts_adjustment_ += (uint64_t)std::numeric_limits<uint32_t>::max();
		}
		ptr = ptr + 4;
		cw_index_ = *ptr++;

		uint32_t wd = fmp4_read_uint32((char *)ptr);
		std::bitset<32> a(wd);
		tier_ = (wd & 0xFFF00000) >> 20;
		splice_command_length_ = (0x000FFF00 & wd) >> 8;
		splice_command_type_ = (uint8_t)(0x000000FF & wd);
		ptr += 4;
		descriptor_loop_length_ = fmp4_read_uint16((char *)ptr);

		ptr += descriptor_loop_length_;
		if (splice_command_type_ == 0x05) {
			splice_insert_event_id_ = fmp4_read_uint32((char *)ptr);
			ptr += 4;
			std::bitset<8> bb(*ptr);
			splice_event_cancel_indicator_ = bb[7];
		}
	}